

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add127_test.cc
# Opt level: O0

void intgemm::anon_unknown_0::TestMultiplyShiftInt<intgemm::SSSE3::Kernels8>
               (Index A_rows,Index width,Index B_cols,float int_tolerance,float float_tolerance,
               float MSE_float_tolerance,float MSE_int_tolerance)

{
  anon_class_16_2_71e48296 callback;
  anon_class_16_2_f8caf180 callback_00;
  UnquantizeAndAddBiasAndWrite callback_01;
  ostream *poVar1;
  float *pfVar2;
  float *pfVar3;
  char *pcVar4;
  uchar *B_00;
  uchar *A_00;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  result_type_conflict rVar5;
  float unquant_mult_forprep;
  AlignedVector<float> ShiftedBias;
  char *it_3;
  char *__end2_3;
  char *__begin2_3;
  AlignedVector<signed_char> *__range2_3;
  AlignedVector<signed_char> A_prep2;
  AlignedVector<float> float_C;
  AlignedVector<float> slowint_C;
  AlignedVector<signed_char> B_quant;
  AlignedVector<float> test_C;
  AlignedVector<signed_char> B_prep;
  AlignedVector<signed_char> A_prep_old;
  AlignedVector<unsigned_char> A_prep;
  float unquant_mult;
  float quant_mult;
  float alpha;
  float *it_2;
  float *__end2_2;
  float *__begin2_2;
  AlignedVector<float> *__range2_2;
  float *it_1;
  float *__end2_1;
  float *__begin2_1;
  AlignedVector<float> *__range2_1;
  float *it;
  float *__end2;
  float *__begin2;
  AlignedVector<float> *__range2;
  uniform_real_distribution<float> dist;
  mt19937 gen;
  AlignedVector<float> bias;
  AlignedVector<float> B;
  AlignedVector<float> A;
  ostringstream info;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe7b8;
  Index cols;
  uniform_real_distribution<float> *in_stack_ffffffffffffe7c0;
  uint8_t *in_stack_ffffffffffffe7c8;
  AlignedVector<float> *in_stack_ffffffffffffe7d0;
  undefined8 in_stack_ffffffffffffe7e0;
  Index B_cols_00;
  AlignedVector<float> *pAVar6;
  undefined8 in_stack_ffffffffffffe7e8;
  float *in_stack_ffffffffffffe7f0;
  float *in_stack_ffffffffffffe7f8;
  float *in_stack_ffffffffffffe800;
  float *in_stack_ffffffffffffe808;
  anon_class_8_1_8989cfb7 in_stack_ffffffffffffe810;
  undefined4 in_stack_ffffffffffffe818;
  undefined4 in_stack_ffffffffffffe81c;
  Index in_stack_ffffffffffffe820;
  float in_stack_ffffffffffffe824;
  float fVar7;
  int8_t *in_stack_ffffffffffffe828;
  float *in_stack_ffffffffffffe830;
  string local_1708 [32];
  float *local_16e8;
  AlignedVector<float> *pAStack_16e0;
  UnquantizeAndAddBiasAndWrite local_16d8;
  UnquantizeAndAddBiasAndWrite local_16c0;
  float *local_16a8;
  AlignedVector<float> *pAStack_16a0;
  float local_1694;
  AlignedVector<float> local_1690;
  char *local_1680;
  char *local_1678;
  char *local_1670;
  AlignedVector<signed_char> *local_1668;
  Index in_stack_ffffffffffffe9a8;
  Index in_stack_ffffffffffffe9ac;
  Index in_stack_ffffffffffffe9bc;
  Index in_stack_ffffffffffffe9c0;
  Index in_stack_ffffffffffffe9c4;
  float *in_stack_ffffffffffffe9c8;
  float *in_stack_ffffffffffffe9d0;
  UnquantizeAndAddBiasAndWrite in_stack_ffffffffffffe9e0;
  AlignedVector<signed_char> local_1608;
  AlignedVector<signed_char> local_15f8;
  AlignedVector<unsigned_char> local_15e8;
  float local_15d4;
  undefined4 local_15d0;
  float local_15cc;
  float *local_15c8;
  float *local_15c0;
  float *local_15b8;
  AlignedVector<float> *local_15b0;
  float *local_15a8;
  float *local_15a0;
  float *local_1598;
  AlignedVector<float> *local_1590;
  float *local_1588;
  float *local_1580;
  float *local_1578;
  AlignedVector<float> *local_1570;
  float in_stack_ffffffffffffefa0;
  float in_stack_ffffffffffffefa4;
  float in_stack_ffffffffffffefa8;
  float in_stack_ffffffffffffefac;
  string *in_stack_ffffffffffffefb0;
  size_t in_stack_ffffffffffffefb8;
  float *in_stack_ffffffffffffefc0;
  float *in_stack_ffffffffffffefc8;
  float *in_stack_ffffffffffffefd0;
  AlignedVector<float> local_1d8;
  AlignedVector<float> local_1c8;
  AlignedVector<float> local_1b8 [2];
  ostringstream local_198 [396];
  uint local_c;
  uint local_8;
  uint local_4;
  
  local_c = in_EDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"8-bit SSSE3");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_4);
  poVar1 = std::operator<<(poVar1,'\t');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8);
  poVar1 = std::operator<<(poVar1,'\t');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
  std::operator<<(poVar1,'\n');
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe7d0,(size_t)in_stack_ffffffffffffe7c8,
             (size_t)in_stack_ffffffffffffe7c0);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe7d0,(size_t)in_stack_ffffffffffffe7c8,
             (size_t)in_stack_ffffffffffffe7c0);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe7d0,(size_t)in_stack_ffffffffffffe7c8,
             (size_t)in_stack_ffffffffffffe7c0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0x1eb52f);
  std::uniform_real_distribution<float>::uniform_real_distribution
            (in_stack_ffffffffffffe7c0,(float)((ulong)in_stack_ffffffffffffe7b8 >> 0x20),
             SUB84(in_stack_ffffffffffffe7b8,0));
  local_1570 = local_1b8;
  local_1578 = AlignedVector<float>::begin(local_1570);
  local_1580 = AlignedVector<float>::end(local_1570);
  for (; local_1578 != local_1580; local_1578 = local_1578 + 1) {
    local_1588 = local_1578;
    rVar5 = std::uniform_real_distribution<float>::operator()
                      (in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
    *local_1588 = rVar5;
  }
  local_1590 = &local_1c8;
  local_1598 = AlignedVector<float>::begin(local_1590);
  local_15a0 = AlignedVector<float>::end(local_1590);
  for (; B_cols_00 = (Index)((ulong)in_stack_ffffffffffffe7e0 >> 0x20), local_1598 != local_15a0;
      local_1598 = local_1598 + 1) {
    local_15a8 = local_1598;
    rVar5 = std::uniform_real_distribution<float>::operator()
                      (in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
    *local_15a8 = rVar5;
  }
  local_15b0 = &local_1d8;
  local_15b8 = AlignedVector<float>::begin(local_15b0);
  cols = (Index)((ulong)in_stack_ffffffffffffe7b8 >> 0x20);
  local_15c0 = AlignedVector<float>::end(local_15b0);
  for (; local_15b8 != local_15c0; local_15b8 = local_15b8 + 1) {
    local_15c8 = local_15b8;
    *local_15b8 = 0.0;
  }
  local_15cc = 2.0;
  local_15d0 = 0x427e0000;
  local_15d4 = 0.0002480005;
  AlignedVector<float>::size(local_1b8);
  AlignedVector<unsigned_char>::AlignedVector
            ((AlignedVector<unsigned_char> *)in_stack_ffffffffffffe7d0,
             (size_t)in_stack_ffffffffffffe7c8,(size_t)in_stack_ffffffffffffe7c0);
  AlignedVector<float>::size(local_1b8);
  AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffe7d0,
             (size_t)in_stack_ffffffffffffe7c8,(size_t)in_stack_ffffffffffffe7c0);
  AlignedVector<float>::size(&local_1c8);
  AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffe7d0,
             (size_t)in_stack_ffffffffffffe7c8,(size_t)in_stack_ffffffffffffe7c0);
  AlignedVector<float>::begin(local_1b8);
  AlignedVector<unsigned_char>::begin(&local_15e8);
  SSSE3::Kernels8::PrepareA
            ((float *)in_stack_ffffffffffffe7d0,in_stack_ffffffffffffe7c8,
             (float)((ulong)in_stack_ffffffffffffe7c0 >> 0x20),(Index)in_stack_ffffffffffffe7c0,cols
            );
  AlignedVector<float>::begin(local_1b8);
  AlignedVector<signed_char>::begin(&local_15f8);
  SSSE3::Kernels8::PrepareA
            ((float *)in_stack_ffffffffffffe7d0,(int8_t *)in_stack_ffffffffffffe7c8,
             (float)((ulong)in_stack_ffffffffffffe7c0 >> 0x20),(Index)in_stack_ffffffffffffe7c0,cols
            );
  AlignedVector<float>::begin(&local_1c8);
  AlignedVector<signed_char>::begin(&local_1608);
  SSSE3::Kernels8::PrepareB
            ((float *)in_stack_ffffffffffffe810.bias,(int8_t *)in_stack_ffffffffffffe808,
             (float)((ulong)in_stack_ffffffffffffe800 >> 0x20),(Index)in_stack_ffffffffffffe800,
             (Index)((ulong)in_stack_ffffffffffffe7f8 >> 0x20));
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe7d0,(size_t)in_stack_ffffffffffffe7c8,
             (size_t)in_stack_ffffffffffffe7c0);
  AlignedVector<float>::size(&local_1c8);
  AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffe7d0,
             (size_t)in_stack_ffffffffffffe7c8,(size_t)in_stack_ffffffffffffe7c0);
  AlignedVector<float>::begin(&local_1c8);
  AlignedVector<signed_char>::begin((AlignedVector<signed_char> *)&stack0xffffffffffffe9d8);
  AlignedVector<float>::size(&local_1c8);
  SSSE3::Kernels8::Quantize
            (in_stack_ffffffffffffe830,in_stack_ffffffffffffe828,in_stack_ffffffffffffe824,
             in_stack_ffffffffffffe820);
  AlignedVector<float>::size((AlignedVector<float> *)&stack0xffffffffffffe9e8);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe7d0,(size_t)in_stack_ffffffffffffe7c8,
             (size_t)in_stack_ffffffffffffe7c0);
  AlignedVector<float>::size((AlignedVector<float> *)&stack0xffffffffffffe9e8);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe7d0,(size_t)in_stack_ffffffffffffe7c8,
             (size_t)in_stack_ffffffffffffe7c0);
  AlignedVector<float>::begin(local_1b8);
  AlignedVector<float>::begin(&local_1c8);
  AlignedVector<float>::begin((AlignedVector<float> *)&stack0xffffffffffffe9b8);
  pAVar6 = &local_1d8;
  references::
  Multiply<float,_float,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_add127_test_cc:249:86),_nullptr>
            (in_stack_ffffffffffffe808,in_stack_ffffffffffffe800,in_stack_ffffffffffffe7f8,
             (Index)((ulong)in_stack_ffffffffffffe7f0 >> 0x20),(Index)in_stack_ffffffffffffe7f0,
             (Index)((ulong)in_stack_ffffffffffffe7e8 >> 0x20),in_stack_ffffffffffffe810);
  AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffe7d0,
             (size_t)in_stack_ffffffffffffe7c8,(size_t)in_stack_ffffffffffffe7c0);
  local_1668 = (AlignedVector<signed_char> *)&stack0xffffffffffffe9a0;
  local_1670 = AlignedVector<signed_char>::begin(local_1668);
  local_1678 = AlignedVector<signed_char>::end(local_1668);
  for (; local_1670 != local_1678; local_1670 = local_1670 + 1) {
    local_1680 = local_1670;
    *local_1670 = '\x01';
  }
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe7d0,(size_t)in_stack_ffffffffffffe7c8,
             (size_t)in_stack_ffffffffffffe7c0);
  local_1694 = (-local_15cc * local_15cc) / 127.0;
  AlignedVector<signed_char>::begin((AlignedVector<signed_char> *)&stack0xffffffffffffe9a0);
  AlignedVector<signed_char>::begin((AlignedVector<signed_char> *)&stack0xffffffffffffe9d8);
  AlignedVector<float>::begin(&local_1690);
  local_16a8 = &local_1694;
  pAStack_16a0 = &local_1d8;
  callback.bias._0_4_ = in_stack_ffffffffffffe818;
  callback.unquant_mult_forprep = (float *)in_stack_ffffffffffffe810.bias;
  callback.bias._4_4_ = in_stack_ffffffffffffe81c;
  references::
  Multiply<signed_char,_signed_char,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_add127_test_cc:262:97),_nullptr>
            ((char *)in_stack_ffffffffffffe800,(char *)in_stack_ffffffffffffe7f8,
             in_stack_ffffffffffffe7f0,(Index)((ulong)in_stack_ffffffffffffe7e8 >> 0x20),
             (Index)in_stack_ffffffffffffe7e8,B_cols_00,callback);
  AlignedVector<signed_char>::begin(&local_1608);
  fVar7 = local_1694;
  pfVar2 = AlignedVector<float>::begin(&local_1d8);
  pfVar3 = AlignedVector<float>::begin(&local_1d8);
  callbacks::UnquantizeAndAddBiasAndWrite::UnquantizeAndAddBiasAndWrite
            (&local_16c0,fVar7,pfVar2,pfVar3);
  callback_01._4_4_ = in_stack_ffffffffffffe9c4;
  callback_01.unquant_mult = (float)in_stack_ffffffffffffe9c0;
  callback_01.bias_addr = in_stack_ffffffffffffe9c8;
  callback_01.output_addr = in_stack_ffffffffffffe9d0;
  SSSE3::Kernels8::PrepareBias<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            ((int8_t *)pAVar6,in_stack_ffffffffffffe9ac,in_stack_ffffffffffffe9a8,callback_01);
  AlignedVector<unsigned_char>::begin(&local_15e8);
  pcVar4 = AlignedVector<signed_char>::begin(&local_1608);
  fVar7 = local_15d4;
  pfVar2 = AlignedVector<float>::begin(&local_1d8);
  pfVar3 = AlignedVector<float>::begin((AlignedVector<float> *)&stack0xffffffffffffe9e8);
  callbacks::UnquantizeAndAddBiasAndWrite::UnquantizeAndAddBiasAndWrite
            (&local_16d8,fVar7,pfVar2,pfVar3);
  SSSE3::Kernels8::Multiply8Shift<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            ((uint8_t *)in_stack_ffffffffffffe9d0,(int8_t *)in_stack_ffffffffffffe9c8,
             in_stack_ffffffffffffe9c4,in_stack_ffffffffffffe9c0,in_stack_ffffffffffffe9bc,
             in_stack_ffffffffffffe9e0);
  B_00 = AlignedVector<unsigned_char>::begin(&local_15e8);
  A_00 = (uchar *)AlignedVector<signed_char>::begin
                            ((AlignedVector<signed_char> *)&stack0xffffffffffffe9d8);
  AlignedVector<float>::begin((AlignedVector<float> *)&stack0xffffffffffffe9c8);
  local_16e8 = &local_15d4;
  pAStack_16e0 = &local_1690;
  callback_00.ShiftedBias._0_4_ = local_4;
  callback_00.unquant_mult = (float *)pcVar4;
  callback_00.ShiftedBias._4_4_ = local_8;
  references::
  Multiply<unsigned_char,_signed_char,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_add127_test_cc:273:99),_nullptr>
            (A_00,(char *)B_00,in_stack_ffffffffffffe7f0,
             (Index)((ulong)in_stack_ffffffffffffe7e8 >> 0x20),(Index)in_stack_ffffffffffffe7e8,
             B_cols_00,callback_00);
  AlignedVector<float>::begin((AlignedVector<float> *)&stack0xffffffffffffe9b8);
  AlignedVector<float>::begin((AlignedVector<float> *)&stack0xffffffffffffe9c8);
  pAVar6 = (AlignedVector<float> *)&stack0xffffffffffffe9e8;
  AlignedVector<float>::begin(pAVar6);
  AlignedVector<float>::size(pAVar6);
  std::__cxx11::ostringstream::str();
  CompareMSE(in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc0,
             in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0,in_stack_ffffffffffffefac,
             in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0);
  std::__cxx11::string::~string(local_1708);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1ebfae);
  AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x1ebfbb);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1ebfc8);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1ebfd5);
  AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x1ebfe2);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1ebfef);
  AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x1ebffc);
  AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x1ec009);
  AlignedVector<unsigned_char>::~AlignedVector((AlignedVector<unsigned_char> *)0x1ec016);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1ec023);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1ec030);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1ec03d);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void TestMultiplyShiftInt(Index A_rows, Index width, Index B_cols,
 float int_tolerance=.1, float float_tolerance=1, float MSE_float_tolerance=0, float MSE_int_tolerance=0) {
  std::ostringstream info;
  info << Routine::kName << "\t" << A_rows << '\t' << width << '\t' << B_cols << '\n';

  // Initialize A and B.
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  AlignedVector<float> bias(B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }
  for (auto& it : bias) {
    it = 0;
  }

  float alpha = 2.0f;
  float quant_mult = 127.0f / alpha;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<uint8_t> A_prep(A.size());
  AlignedVector<int8_t> A_prep_old(A.size());
  AlignedVector<int8_t> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareA(A.begin(), A_prep_old.begin(), quant_mult, A_rows, width); //Non shited version
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);

  /*
   * Reference float multiplication
   */
  AlignedVector<int8_t> B_quant(B.size());
  Routine::Quantize(B.begin(), B_quant.begin(), quant_mult, static_cast<Index>(B.size()));
  AlignedVector<float> slowint_C(test_C.size());
  // Taking the original A_preparation which means A would be int8_t
  // references::Multiply(A_prep.begin(), B_quant.begin(), slowint_C.begin(), A_rows, width, B_cols, [&](int32_t sum, const callbacks::OutputBufferInfo& info) {
  //   return sum * unquant_mult + bias[info.col_idx];
  // });

  AlignedVector<float> float_C(test_C.size());
  references::Multiply(A.begin(), B.begin(), float_C.begin(), A_rows, width, B_cols, [&](double sum, const callbacks::OutputBufferInfo& info) {
    return static_cast<float>(sum) + bias[info.col_idx];
  });
  /*
   * Multiply8 shift multiplication
   */
  //First prepare SlowInteger Bias:
  AlignedVector<int8_t> A_prep2(1*width);
  for (auto& it : A_prep2) {
    it = 1;
  }
  AlignedVector<float> ShiftedBias(B_cols);
  float unquant_mult_forprep = (-1)*(alpha)*(alpha)/(127.0f); //Minus one to invert add_ps later on
  references::Multiply(A_prep2.begin(), B_quant.begin(), ShiftedBias.begin(), 1, width, B_cols, [&](int32_t sum, const callbacks::OutputBufferInfo& info) {
    return sum * unquant_mult_forprep + bias[info.col_idx];
  });
  

  //Now prepare Fast integer Bias
  Routine::PrepareBias(B_prep.begin(), width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult_forprep, bias.begin(), bias.begin()));
  Routine::Multiply8Shift(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult, bias.begin(), test_C.begin()));

  // Reference INT VERSION HERE with ADD127
  // Taking the original A_preparation which means A would be int8_t
  references::Multiply(A_prep.begin(), B_quant.begin(), slowint_C.begin(), A_rows, width, B_cols, [&](int32_t sum, const callbacks::OutputBufferInfo& info) {
    return sum * unquant_mult + ShiftedBias[info.col_idx];
  });

  CompareMSE(float_C.begin(), slowint_C.begin(), test_C.begin(), test_C.size(), info.str(),
   int_tolerance, float_tolerance, MSE_float_tolerance, MSE_int_tolerance);
}